

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnknownHandleManager.cpp
# Opt level: O2

void __thiscall
helics::UnknownHandleManager::processUnknownLinks
          (UnknownHandleManager *this,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType)>
          *cfunc)

{
  __node_base *p_Var1;
  
  p_Var1 = &(this->unknown_links)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType)>
    ::operator()(cfunc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var1 + 1),PUBLICATION,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 5),
                 INPUT);
  }
  p_Var1 = &(this->unknown_endpoint_links)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType)>
    ::operator()(cfunc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var1 + 1),ENDPOINT,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 5),
                 ENDPOINT);
  }
  p_Var1 = &(this->unknown_dest_filters)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType)>
    ::operator()(cfunc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var1 + 1),FILTER,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 5),
                 ENDPOINT);
  }
  p_Var1 = &(this->unknown_src_filters)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType)>
    ::operator()(cfunc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var1 + 1),FILTER,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 5),
                 ENDPOINT);
  }
  return;
}

Assistant:

void UnknownHandleManager::processUnknownLinks(
    const std::function<
        void(const std::string& origin, InterfaceType, const std::string& target, InterfaceType)>&
        cfunc) const
{
    for (const auto& dlink : unknown_links) {
        cfunc(dlink.first, InterfaceType::PUBLICATION, dlink.second, InterfaceType::INPUT);
    }
    for (const auto& uept : unknown_endpoint_links) {
        cfunc(uept.first, InterfaceType::ENDPOINT, uept.second, InterfaceType::ENDPOINT);
    }
    for (const auto& ufilt : unknown_dest_filters) {
        cfunc(ufilt.first, InterfaceType::FILTER, ufilt.second, InterfaceType::ENDPOINT);
    }
    for (const auto& ufilt : unknown_src_filters) {
        cfunc(ufilt.first, InterfaceType::FILTER, ufilt.second, InterfaceType::ENDPOINT);
    }
}